

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_StaAreSharpVar(Gia_StaAre_t *p1,Gia_StaAre_t *p2,int nWords)

{
  uint uWord;
  int iVar1;
  int local_30;
  int local_2c;
  int iVar;
  int w;
  uint Word;
  int nWords_local;
  Gia_StaAre_t *p2_local;
  Gia_StaAre_t *p1_local;
  
  local_30 = -1;
  local_2c = 0;
  do {
    if (nWords <= local_2c) {
      return local_30;
    }
    uWord = ((uint)(&p1[1].iPrev)[local_2c] ^ (uint)(&p1[1].iPrev)[local_2c] >> 1 ^ 0xffffffff) &
            ((uint)(&p2[1].iPrev)[local_2c] ^ (uint)(&p2[1].iPrev)[local_2c] >> 1) & 0x55555555;
    if (uWord != 0) {
      iVar1 = Gia_WordHasOneBit(uWord);
      if (iVar1 == 0) {
        return -1;
      }
      if (-1 < local_30) {
        return -1;
      }
      iVar1 = Gia_WordFindFirstBit(uWord);
      local_30 = local_2c * 0x10 + iVar1 / 2;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static inline int Gia_StaAreSharpVar( Gia_StaAre_t * p1, Gia_StaAre_t * p2, int nWords )
{
    unsigned Word;
    int w, iVar = -1;
    for ( w = 0; w < nWords; w++ )
    {
        Word = (~(p1->pData[w] ^ (p1->pData[w] >> 1))) & (p2->pData[w] ^ (p2->pData[w] >> 1)) & 0x55555555;
        if ( Word == 0 )
            continue;
        if ( !Gia_WordHasOneBit(Word) )
            return -1;
        // has exactly one bit
        if ( iVar >= 0 )
            return -1;
        // the first variable of this type
        iVar = 16 * w + Gia_WordFindFirstBit( Word ) / 2;
    }
    return iVar;
}